

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,MethodInvocation *method_invocation)

{
  bool bVar1;
  int iVar2;
  ExpressionList *this_00;
  Expression *expression;
  ExpressionWrapper *pEVar3;
  undefined4 extraout_var;
  vector<Expression_*,_std::allocator<Expression_*>_> *this_01;
  reference ppEVar4;
  SubtreeWrapper *pSVar5;
  undefined4 extraout_var_00;
  CallExpression *this_02;
  NameExpression *this_03;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  Label local_120;
  string local_100;
  Symbol local_e0;
  string local_c0;
  Symbol local_a0;
  Symbol *local_80;
  Symbol *symbol;
  Symbol class_name;
  Expression *expr;
  iterator __end2;
  iterator __begin2;
  vector<Expression_*,_std::allocator<Expression_*>_> *__range2;
  Expression *address;
  ExpressionList *irt_expressions;
  MethodInvocation *method_invocation_local;
  IRTreeBuildVisitor *this_local;
  
  this_00 = (ExpressionList *)operator_new(0x20);
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_BaseElement)._vptr_BaseElement = (_func_int **)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  IRT::ExpressionList::ExpressionList(this_00);
  expression = IRT::FrameTranslator::GetAddress(this->current_frame_,&method_invocation->call_from_)
  ;
  pEVar3 = (ExpressionWrapper *)operator_new(0x10);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar3,expression);
  iVar2 = (*(pEVar3->super_SubtreeWrapper)._vptr_SubtreeWrapper[2])();
  IRT::ExpressionList::Add(this_00,(Expression *)CONCAT44(extraout_var,iVar2));
  if (method_invocation->arguments_list_ != (MethodExpression *)0x0) {
    this_01 = &method_invocation->arguments_list_->list_of_expressions_;
    __end2 = std::vector<Expression_*,_std::allocator<Expression_*>_>::begin(this_01);
    expr = (Expression *)std::vector<Expression_*,_std::allocator<Expression_*>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>
                                       *)&expr), bVar1) {
      ppEVar4 = __gnu_cxx::
                __normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>
                ::operator*(&__end2);
      class_name.name_.field_2._8_8_ = *ppEVar4;
      pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                         (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                          (Node *)class_name.name_.field_2._8_8_);
      iVar2 = (*pSVar5->_vptr_SubtreeWrapper[2])();
      IRT::ExpressionList::Add(this_00,(Expression *)CONCAT44(extraout_var_00,iVar2));
      __gnu_cxx::
      __normal_iterator<Expression_**,_std::vector<Expression_*,_std::allocator<Expression_*>_>_>::
      operator++(&__end2);
    }
  }
  Symbol::Symbol((Symbol *)&symbol);
  bVar1 = std::operator==(&method_invocation->call_from_,"this");
  if (bVar1) {
    Symbol::operator=((Symbol *)&symbol,&this->current_layer_->class_symbol_);
  }
  else {
    std::__cxx11::string::string((string *)&local_c0,(string *)&method_invocation->call_from_);
    Symbol::Symbol(&local_a0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    local_80 = &local_a0;
    TypeResolving_abi_cxx11_(&local_100,this,local_80);
    Symbol::Symbol(&local_e0,&local_100);
    Symbol::operator=((Symbol *)&symbol,&local_e0);
    Symbol::~Symbol(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    Symbol::~Symbol(&local_a0);
  }
  pEVar3 = (ExpressionWrapper *)operator_new(0x10);
  this_02 = (CallExpression *)operator_new(0x18);
  this_03 = (NameExpression *)operator_new(0x28);
  Symbol::GetName_abi_cxx11_(&local_180,(Symbol *)&symbol);
  std::operator+(&local_160,&local_180,"_");
  std::operator+(&local_140,&local_160,&method_invocation->method_name_);
  IRT::Label::Label(&local_120,&local_140);
  IRT::NameExpression::NameExpression(this_03,&local_120);
  IRT::CallExpression::CallExpression(this_02,(Expression *)this_03,this_00);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar3,(Expression *)this_02);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar3;
  IRT::Label::~Label(&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  Symbol::~Symbol((Symbol *)&symbol);
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(MethodInvocation* method_invocation) {
  auto* irt_expressions = new IRT::ExpressionList();

  auto address = current_frame_->GetAddress(method_invocation->call_from_);
  irt_expressions->Add((new IRT::ExpressionWrapper(address))->ToExpression());

  if (method_invocation->arguments_list_ != nullptr) {
    for (auto expr : method_invocation->arguments_list_->list_of_expressions_) {
      irt_expressions->Add(Accept(expr)->ToExpression());
    }
  }

  Symbol class_name;
  if (method_invocation->call_from_ == "this") {
    class_name = current_layer_->class_symbol_;
  } else {
    const Symbol& symbol = Symbol(method_invocation->call_from_);

    class_name = Symbol(TypeResolving(symbol));
  }

  tos_value_ = new IRT::ExpressionWrapper(new IRT::CallExpression(
      new IRT::NameExpression(IRT::Label(
          class_name.GetName() + "_" + method_invocation->method_name_)),
      irt_expressions));
}